

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O3

char * flecs::_::component_info<Asteroid>::name(world_t *world)

{
  _Bool condition;
  
  condition = true;
  if (s_id == 0) {
    id(world,(char *)0x0,true);
    condition = s_id != 0;
  }
  _ecs_assert(condition,0xc,(char *)0x0,"s_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe19);
  if (s_id != 0) {
    return s_name_abi_cxx11_;
  }
  __assert_fail("s_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xe19,
                "static const char *flecs::_::component_info<Asteroid>::name(world_t *) [T = Asteroid]"
               );
}

Assistant:

static const char* name(world_t *world = nullptr) {
        // If no id has been registered yet, do it now.
        if (!s_id) {
            id(world);
        }

        // By now we should have a valid identifier
        ecs_assert(s_id != 0, ECS_INTERNAL_ERROR, NULL);

        // If the id is set, the name should also have been set
        return s_name.c_str();
    }